

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDF::readHintStream(QPDF *this,Pipeline *pl,qpdf_offset_t offset,size_t length)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  bool bVar3;
  mapped_type *pmVar4;
  long *plVar5;
  QPDFExc *pQVar6;
  size_type *psVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  qpdf_offset_t __val;
  unsigned_long in_R8;
  long __val_00;
  qpdf_offset_t __val_01;
  QPDFObjectHandle QVar9;
  string_view msg;
  string local_160;
  element_type *local_140;
  string local_138;
  QPDFObjectHandle length_obj;
  QPDFObjectHandle H;
  QPDFObjGen og;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  og.obj = 0;
  og.gen = 0;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_140 = (element_type *)this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,"linearization hint stream","");
  readObjectAtOffset((QPDF *)&H,SUB81(pl,0),0,(string *)length,(QPDFObjGen)&local_160,
                     (QPDFObjGen *)0x0,SUB81(&og,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  pmVar4 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[]((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                         *)(pl->_vptr_Pipeline + 0x35),&og);
  __val = pmVar4->end_before_space;
  __val_01 = pmVar4->end_after_space;
  bVar3 = QPDFObjectHandle::isStream(&H);
  if (!bVar3) {
    pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,"linearization dictionary","");
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"hint table is not a stream","");
    damagedPDF(pQVar6,(QPDF *)pl,&local_160,&local_138);
    __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_140);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"/Length","");
  QPDFObjectHandle::getKey(&length_obj,(string *)local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  bVar3 = QPDFObjectHandle::isIndirect(&length_obj);
  if (bVar3) {
    QPDFObjectHandle::getIntValue(&length_obj);
    pp_Var2 = pl->_vptr_Pipeline;
    local_160._M_dataplus._M_p = (pointer)QPDFObjectHandle::getObjGen(&length_obj);
    pmVar4 = std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::operator[]((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                           *)(pp_Var2 + 0x35),(key_type *)&local_160);
    __val = pmVar4->end_before_space;
    __val_01 = pmVar4->end_after_space;
  }
  if ((long)in_R8 < 0) {
    QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(in_R8);
  }
  __val_00 = in_R8 + length;
  if ((__val <= __val_00) && (__val_00 <= __val_01)) {
    QPDFObjectHandle::pipeStreamData(&H,(Pipeline *)offset,0,qpdf_dl_specialized,false,false);
    _Var8._M_pi = extraout_RDX;
    if (length_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (length_obj.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      _Var8._M_pi = extraout_RDX_00;
    }
    if (H.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (H.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var8._M_pi = extraout_RDX_01;
    }
    QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var8._M_pi;
    QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_140;
    return (QPDFObjectHandle)
           QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__cxx11::to_string(&local_90,__val_00);
  std::operator+(&local_70,"expected = ",&local_90);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_f0._M_dataplus._M_p = (pointer)*plVar5;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar7) {
    local_f0.field_2._M_allocated_capacity = *psVar7;
    local_f0.field_2._8_8_ = plVar5[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar7;
  }
  local_f0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::to_string(&local_b0,__val);
  std::operator+(&local_50,&local_f0,&local_b0);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)*plVar5;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_138._M_dataplus._M_p == psVar7) {
    local_138.field_2._M_allocated_capacity = *psVar7;
    local_138.field_2._8_8_ = plVar5[3];
    local_138._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar7;
  }
  local_138._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::to_string(&local_d0,__val_01);
  std::operator+(&local_160,&local_138,&local_d0);
  msg._M_str = local_160._M_dataplus._M_p;
  msg._M_len = local_160._M_string_length;
  linearizationWarning((QPDF *)pl,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,"linearization dictionary","");
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"hint table length mismatch","");
  damagedPDF(pQVar6,(QPDF *)pl,&local_160,&local_138);
  __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFObjectHandle
QPDF::readHintStream(Pipeline& pl, qpdf_offset_t offset, size_t length)
{
    QPDFObjGen og;
    QPDFObjectHandle H =
        readObjectAtOffset(false, offset, "linearization hint stream", QPDFObjGen(0, 0), og, false);
    ObjCache& oc = m->obj_cache[og];
    qpdf_offset_t min_end_offset = oc.end_before_space;
    qpdf_offset_t max_end_offset = oc.end_after_space;
    if (!H.isStream()) {
        throw damagedPDF("linearization dictionary", "hint table is not a stream");
    }

    QPDFObjectHandle Hdict = H.getDict();

    // Some versions of Acrobat make /Length indirect and place it immediately after the stream,
    // increasing length to cover it, even though the specification says all objects in the
    // linearization parameter dictionary must be direct.  We have to get the file position of the
    // end of length in this case.
    QPDFObjectHandle length_obj = Hdict.getKey("/Length");
    if (length_obj.isIndirect()) {
        QTC::TC("qpdf", "QPDF hint table length indirect");
        // Force resolution
        (void)length_obj.getIntValue();
        ObjCache& oc2 = m->obj_cache[length_obj.getObjGen()];
        min_end_offset = oc2.end_before_space;
        max_end_offset = oc2.end_after_space;
    } else {
        QTC::TC("qpdf", "QPDF hint table length direct");
    }
    qpdf_offset_t computed_end = offset + toO(length);
    if ((computed_end < min_end_offset) || (computed_end > max_end_offset)) {
        linearizationWarning(
            "expected = " + std::to_string(computed_end) +
            "; actual = " + std::to_string(min_end_offset) + ".." + std::to_string(max_end_offset));
        throw damagedPDF("linearization dictionary", "hint table length mismatch");
    }
    H.pipeStreamData(&pl, 0, qpdf_dl_specialized);
    return Hdict;
}